

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O0

void * TPZFront<double>::STensorProductMTData::Execute(void *data)

{
  long *plVar1;
  undefined4 *in_RDI;
  TPZFront<double> *mat;
  STensorProductThreadData *mypair;
  size_t in_stack_00000408;
  char *in_stack_00000410;
  
  if (in_RDI == (undefined4 *)0x0) {
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  plVar1 = *(long **)(*(long *)(in_RDI + 2) + 0x100);
  if (plVar1 == (long *)0x0) {
    pzinternal::DebugStopImpl(in_stack_00000410,in_stack_00000408);
  }
  (**(code **)(*plVar1 + 0x60))(plVar1,*in_RDI,*(undefined8 *)(in_RDI + 2));
  return (void *)0x0;
}

Assistant:

static void *Execute(void *data){
			STensorProductThreadData * mypair = static_cast< STensorProductThreadData * >(data);
			if(!mypair) DebugStop();
			TPZFront<TVar> * mat = mypair->second->fMat;
			if(!mat) DebugStop();
			mat->TensorProductIJ(mypair->first,mypair->second);
			return NULL;
		}